

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltc.cpp
# Opt level: O0

void __thiscall ltc::ltc(ltc *this)

{
  ltc *this_local;
  
  brdf::brdf(&this->super_brdf);
  (this->super_brdf)._vptr_brdf = (_func_int **)&PTR__ltc_0025aa20;
  this->_amplitude = 1.0;
  this->_ltc_matrix_inv_determinant = 1.0;
  glm::mat<3,_3,_float,_(glm::precision)0>::mat(&this->_base_frame);
  glm::mat<3,_3,_float,_(glm::precision)0>::mat(&this->_ltc_matrix);
  glm::mat<3,_3,_float,_(glm::precision)0>::mat(&this->_ltc_matrix_inv);
  return;
}

Assistant:

ltc::ltc():
  _amplitude{1.0f},
  _ltc_matrix{},
  _ltc_matrix_inv{},
  _ltc_matrix_inv_determinant{1.0f}
{
}